

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

vector<Function_*,_std::allocator<Function_*>_> * __thiscall
Semantic::SymbolTable::getFreeFunction(SymbolTable *this,string *funcName)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  UndeclaredFunction *this_00;
  string sStack_38;
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->freeFunctions)._M_h,funcName);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&this->freeFunctions,funcName);
    return pmVar2;
  }
  this_00 = (UndeclaredFunction *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&sStack_38,(string *)funcName);
  Err::UndeclaredFunction::UndeclaredFunction(this_00,&sStack_38,0);
  __cxa_throw(this_00,&Err::UndeclaredFunction::typeinfo,
              Err::UndeclaredFunction::~UndeclaredFunction);
}

Assistant:

const std::vector<Function *> &Semantic::SymbolTable::getFreeFunction(const std::string &funcName) const {
    if (freeFunctions.find(funcName) == freeFunctions.end())
        throw Semantic::Err::UndeclaredFunction(funcName, 0);

    return freeFunctions.at(funcName);
}